

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

Txid * __thiscall
cfd::core::MerkleBlock::CalculateHash
          (Txid *__return_storage_ptr__,MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids)

{
  uint64_t height_00;
  ulong pos_00;
  ByteData data;
  Txid right;
  Txid left;
  ByteData local_b8;
  Txid local_a0;
  Txid local_80;
  Txid local_60;
  ByteData local_40;
  
  if (height == 0) {
    Txid::Txid(__return_storage_ptr__,
               (txids->super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>).
               _M_impl.super__Vector_impl_data._M_start + pos);
  }
  else {
    height_00 = height - 1;
    CalculateHash(&local_60,this,height_00,pos * 2,txids);
    Txid::Txid(&local_80);
    pos_00 = pos * 2 | 1;
    if (pos_00 < ~(-1L << ((byte)height_00 & 0x3f)) + this->transaction_count >>
                 ((byte)height_00 & 0x3f)) {
      CalculateHash(&local_a0,this,height_00,pos_00,txids);
      Txid::operator=(&local_80,&local_a0);
      local_a0._vptr_Txid = (_func_int **)&PTR__Txid_0068dcd8;
      if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      Txid::operator=(&local_80,&local_60);
    }
    Txid::GetData(&local_b8,&local_60);
    Txid::GetData(&local_40,&local_80);
    ByteData::Concat<cfd::core::ByteData>((ByteData *)&local_a0,&local_b8,&local_40);
    if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    HashUtil::Sha256D((ByteData256 *)&local_b8,(ByteData *)&local_a0);
    Txid::Txid(__return_storage_ptr__,(ByteData256 *)&local_b8);
    if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0._vptr_Txid != (_func_int **)0x0) {
      operator_delete(local_a0._vptr_Txid);
    }
    local_80._vptr_Txid = (_func_int **)&PTR__Txid_0068dcd8;
    if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_60._vptr_Txid = (_func_int **)&PTR__Txid_0068dcd8;
    if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Txid MerkleBlock::CalculateHash(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids) {
  if (height == 0) return txids[pos];

  Txid left = CalculateHash(height - 1, pos * 2, txids);
  Txid right;
  if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
    right = CalculateHash(height - 1, pos * 2 + 1, txids);
  } else {
    right = left;
  }
  ByteData data = left.GetData().Concat(right.GetData());
  return Txid(HashUtil::Sha256D(data));
}